

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_function.h
# Opt level: O0

duk_ret_t dukglue::detail::FuncInfoHolder<void,_Shape_*>::FuncRuntime::call_native_function
                    (duk_context *ctx)

{
  _func_void_Shape_ptr *funcToCall_00;
  void *ctx_00;
  tuple<Shape_*> local_28;
  _func_void_Shape_ptr *local_20;
  _func_void_Shape_ptr *funcToCall;
  void *fp_void;
  duk_context *ctx_local;
  
  fp_void = ctx;
  duk_push_current_function(ctx);
  duk_get_prop_string((duk_context *)fp_void,-1,anon_var_dwarf_da7c);
  funcToCall = (_func_void_Shape_ptr *)duk_require_pointer((duk_context *)fp_void,-1);
  if (funcToCall == (_func_void_Shape_ptr *)0x0) {
    duk_error_raw((duk_context *)fp_void,-6,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_function.h"
                  ,0x41,"what even");
  }
  duk_pop_2((duk_context *)fp_void);
  ctx_00 = fp_void;
  funcToCall_00 = funcToCall;
  local_20 = funcToCall;
  get_stack_values<Shape*>((detail *)&local_28,(duk_context *)fp_void);
  FuncInfoHolder<void,Shape*>::FuncRuntime::actually_call<void,Shape*>
            ((duk_context *)ctx_00,funcToCall_00,&local_28);
  return 0;
}

Assistant:

static duk_ret_t call_native_function(duk_context* ctx)
				{
					duk_push_current_function(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "func_ptr");
					void* fp_void = duk_require_pointer(ctx, -1);
					if (fp_void == NULL) {
						duk_error(ctx, DUK_RET_TYPE_ERROR, "what even");
						return DUK_RET_TYPE_ERROR;
					}

					duk_pop_2(ctx);

          static_assert(sizeof(RetType(*)(Ts...)) == sizeof(void*), "Function pointer and data pointer are different sizes");
					RetType(*funcToCall)(Ts...) = reinterpret_cast<RetType(*)(Ts...)>(fp_void);

					actually_call(ctx, funcToCall, dukglue::detail::get_stack_values<Ts...>(ctx));
					return std::is_void<RetType>::value ? 0 : 1;
				}